

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_mtrie_impl.hpp
# Opt level: O0

void __thiscall
zmq::generic_mtrie_t<zmq::pipe_t>::match<zmq::xpub_t*>
          (generic_mtrie_t<zmq::pipe_t> *this,prefix_t data_,size_t size_,
          _func_void_value_t_ptr_xpub_t_ptr *func_,xpub_t *arg_)

{
  bool bVar1;
  iterator this_00;
  reference pppVar2;
  set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> *in_RCX;
  long in_RDX;
  byte *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  iterator end;
  iterator it;
  generic_mtrie_t<zmq::pipe_t> *current;
  set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
  *in_stack_ffffffffffffffb8;
  _Self local_38;
  long *local_30;
  undefined8 local_28;
  set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> *local_20;
  long local_18;
  byte *local_10;
  
  local_30 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    if (local_30 == (long *)0x0) {
      return;
    }
    if (*local_30 != 0) {
      local_38._M_node =
           (_Base_ptr)
           std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::begin
                     (in_stack_ffffffffffffffb8);
      this_00 = std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::
                end(in_stack_ffffffffffffffb8);
      while (bVar1 = std::operator!=(&local_38,(_Self *)&stack0xffffffffffffffc0), bVar1) {
        in_stack_ffffffffffffffb8 = local_20;
        pppVar2 = std::_Rb_tree_const_iterator<zmq::pipe_t_*>::operator*
                            ((_Rb_tree_const_iterator<zmq::pipe_t_*> *)0x2e442a);
        (*(code *)in_stack_ffffffffffffffb8)(*pppVar2,local_28);
        std::_Rb_tree_const_iterator<zmq::pipe_t_*>::operator++
                  ((_Rb_tree_const_iterator<zmq::pipe_t_*> *)this_00._M_node);
      }
    }
    if (local_18 == 0) {
      return;
    }
    if (*(short *)((long)local_30 + 10) == 0) {
      return;
    }
    if (*(short *)((long)local_30 + 10) == 1) {
      if (*local_10 != *(byte *)(local_30 + 1)) {
        return;
      }
      local_30 = (long *)local_30[2];
    }
    else {
      if (*local_10 < *(byte *)(local_30 + 1)) {
        return;
      }
      if ((uint)*(byte *)(local_30 + 1) + (uint)*(ushort *)((long)local_30 + 10) <= (uint)*local_10)
      {
        return;
      }
      local_30 = *(long **)(local_30[2] +
                           (long)(int)((uint)*local_10 - (uint)*(byte *)(local_30 + 1)) * 8);
    }
    local_10 = local_10 + 1;
    local_18 = local_18 + -1;
  } while( true );
}

Assistant:

void generic_mtrie_t<T>::match (prefix_t data_,
                                size_t size_,
                                void (*func_) (value_t *pipe_, Arg arg_),
                                Arg arg_)
{
    for (generic_mtrie_t *current = this; current; data_++, size_--) {
        //  Signal the pipes attached to this node.
        if (current->_pipes) {
            for (typename pipes_t::iterator it = current->_pipes->begin (),
                                            end = current->_pipes->end ();
                 it != end; ++it) {
                func_ (*it, arg_);
            }
        }

        //  If we are at the end of the message, there's nothing more to match.
        if (!size_)
            break;

        //  If there are no subnodes in the trie, return.
        if (current->_count == 0)
            break;

        if (current->_count == 1) {
            //  If there's one subnode (optimisation).
            if (data_[0] != current->_min) {
                break;
            }
            current = current->_next.node;
        } else {
            //  If there are multiple subnodes.
            if (data_[0] < current->_min
                || data_[0] >= current->_min + current->_count) {
                break;
            }
            current = current->_next.table[data_[0] - current->_min];
        }
    }
}